

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O2

void d68020_mull(m68k_info *info)

{
  m68k_reg mVar1;
  m68k_reg mVar2;
  cs_m68k *op;
  
  if ((info->type & 0x1c) != 0) {
    mVar1 = read_imm_16(info);
    op = build_init_op(info,0x122 - (uint)((mVar1 >> 0xb & 1) != 0),2,4);
    get_ea_mode_op(info,op->operands,info->ir,4);
    mVar2 = mVar1 >> 0xc & M68K_REG_D6;
    op->operands[1].type = M68K_OP_REG_PAIR;
    op->operands[1].address_mode = M68K_AM_NONE;
    op->operands[1].field_0.reg = mVar1 & M68K_REG_D6;
    op->operands[1].field_0.reg_pair.reg_1 = mVar2;
    if ((mVar1 >> 10 & 1) == 0) {
      op->operands[1].type = M68K_OP_REG;
      op->operands[1].field_0.reg = mVar2 + M68K_REG_D0;
    }
    return;
  }
  d68000_invalid(info);
  return;
}

Assistant:

static void d68020_mull(m68k_info *info)
{
	uint extension, insn_signed;
	cs_m68k* ext;
	cs_m68k_op* op0;
	cs_m68k_op* op1;
	uint reg_0, reg_1;


	LIMIT_CPU_TYPES(info, M68020_PLUS);

	extension = read_imm_16(info);
	insn_signed = 0;

	if (BIT_B((extension)))
		insn_signed = 1;

	ext = build_init_op(info, insn_signed ? M68K_INS_MULS : M68K_INS_MULU, 2, 4);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	get_ea_mode_op(info, op0, info->ir, 4);

	reg_0 = extension & 7;
	reg_1 = (extension >> 12) & 7;

	op1->address_mode = M68K_AM_NONE;
	op1->type = M68K_OP_REG_PAIR;
	op1->reg_pair.reg_0 = reg_0;
	op1->reg_pair.reg_1 = reg_1;

	if (!BIT_A(extension)) {
		op1->type = M68K_OP_REG;
		op1->reg = M68K_REG_D0 + reg_1;
	}
}